

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

void __thiscall
iutest::detail::ContainerEqMatcher<std::vector<int,_std::allocator<int>_>_>::~ContainerEqMatcher
          (ContainerEqMatcher<std::vector<int,_std::allocator<int>_>_> *this)

{
  std::__cxx11::string::~string((string *)&this->m_whichIs);
  operator_delete(this,0x30);
  return;
}

Assistant:

class ContainerEqMatcher IUTEST_CXX_FINAL : public IMatcher
{
public:
    explicit ContainerEqMatcher(const T& expected) : m_expected(expected) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        IUTEST_USING_BEGIN_END();
        if IUTEST_COND_LIKELY( Check(begin(m_expected), end(m_expected)
            , begin(actual), end(actual)) )
        {
            return AssertionSuccess();
        }
        return AssertionFailure() << WhichIs();
    }

public:
    ::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        iu_global_format_stringstream strm;
        strm << "ContainerEq: " << PrintToString(m_expected);
        strm << " (" << m_whichIs << ")";
        return strm.str();
    }